

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void CTcPrsNode::s_gen_member_rhs
               (int discard,CTcPrsNode *prop_expr,int prop_is_expr,int argc,int varargs,
               CTcNamedArgs *named_args)

{
  vm_prop_id_t prop_00;
  int iVar1;
  int iVar2;
  size_t in_RCX;
  size_t __n;
  undefined4 in_EDX;
  void *__buf;
  long *in_RSI;
  int in_EDI;
  int in_R8D;
  int *in_R9;
  vm_prop_id_t prop;
  uchar in_stack_000000bf;
  CTcGenTarg *in_stack_000000c0;
  CTcGenTarg *in_stack_ffffffffffffffc8;
  undefined6 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  
  iVar2 = (int)in_RCX;
  __n = in_RCX;
  iVar1 = CTcGenTarg::is_speculative(G_cg);
  if ((iVar1 != 0) && ((iVar2 != 0 || ((in_R9 != (int *)0x0 && (*in_R9 != 0)))))) {
    err_throw(0);
  }
  prop_00 = (**(code **)(*in_RSI + 200))(in_RSI,0,in_EDX);
  if (prop_00 == 0) {
    iVar1 = CTcGenTarg::is_speculative(G_cg);
    if (iVar1 == 0) {
      if (in_R8D != 0) {
        CTcGenTarg::write_op(in_stack_000000c0,in_stack_000000bf);
        CTcGenTarg::write_op(in_stack_000000c0,in_stack_000000bf);
      }
      CTcGenTarg::write_op(in_stack_000000c0,in_stack_000000bf);
      CTcDataStream::write(&G_cs->super_CTcDataStream,(int)(char)in_RCX,__buf,__n);
    }
    else {
      CTcGenTarg::write_op(in_stack_000000c0,in_stack_000000bf);
    }
    CTcGenTarg::note_pop(G_cg,iVar2 + 2);
  }
  else if (iVar2 == 0) {
    in_stack_ffffffffffffffc8 = G_cg;
    CTcGenTarg::is_speculative(G_cg);
    CTcGenTarg::write_op(in_stack_000000c0,in_stack_000000bf);
    CTcDataStream::write_prop_id
              ((CTcDataStream *)CONCAT26(prop_00,in_stack_ffffffffffffffd0),
               (uint)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
    CTcGenTarg::note_pop((CTcGenTarg *)0x27ba42);
  }
  else {
    CTcGenTarg::write_callprop
              ((CTcGenTarg *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),(int)((ulong)in_R9 >> 0x20),
               (int)in_R9,prop_00);
  }
  CTcGenTarg::post_call_cleanup
            ((CTcGenTarg *)CONCAT26(prop_00,in_stack_ffffffffffffffd0),
             (CTcNamedArgs *)in_stack_ffffffffffffffc8);
  if (in_EDI == 0) {
    CTcGenTarg::write_op(in_stack_000000c0,in_stack_000000bf);
    CTcGenTarg::note_push((CTcGenTarg *)0x27bb3c);
  }
  return;
}

Assistant:

void CTcPrsNode::s_gen_member_rhs(int discard,
                                  CTcPrsNode *prop_expr, int prop_is_expr,
                                  int argc, int varargs,
                                  CTcNamedArgs *named_args)
{
    vm_prop_id_t prop;

    /* we can't call methods with arguments in speculative mode */
    if (G_cg->is_speculative()
        && (argc != 0 || (named_args != 0 && named_args->cnt != 0)))
        err_throw(VMERR_BAD_SPEC_EVAL);

    /* get or generate the property ID value */
    prop = prop_expr->gen_code_propid(FALSE, prop_is_expr);

    /* 
     *   if we got a property ID, generate a simple GETPROP or CALLPROP
     *   instruction; otherwise, generate a PTRCALLPROP instruction
     */
    if (prop != VM_INVALID_PROP)
    {
        /* 
         *   we have a constant property ID - generate a GETPROP or
         *   CALLPROP with the property ID as constant data 
         */
        if (argc == 0)
        {
            /* no arguments - generate a GETPROP */
            G_cg->write_op(G_cg->is_speculative()
                           ? OPC_GETPROPDATA : OPC_GETPROP);
            G_cs->write_prop_id(prop);

            /* this pops an object element */
            G_cg->note_pop();
        }
        else
        {
            /* write the CALLPROP instruction */
            G_cg->write_callprop(argc, varargs, prop);
        }
    }
    else
    {
        if (G_cg->is_speculative())
        {
            /* 
             *   speculative - use PTRGETPROPDATA to ensure we don't cause
             *   any side effects 
             */
            G_cg->write_op(OPC_PTRGETPROPDATA);
        }
        else
        {
            /* 
             *   if we have a varargs list, modify the call instruction
             *   that follows to make it a varargs call 
             */
            if (varargs)
            {
                /* swap to get the arg counter back on top */
                G_cg->write_op(OPC_SWAP);
                
                /* write the varargs modifier */
                G_cg->write_op(OPC_VARARGC);
            }

            /* a property pointer is on the stack - write a PTRCALLPROP */
            G_cg->write_op(OPC_PTRCALLPROP);
            G_cs->write((int)argc);
        }

        /* 
         *   ptrcallprop/ptrgetpropdata removes arguments, the object, and
         *   the property 
         */
        G_cg->note_pop(argc + 2);
    }

    /* do post-call cleanup: named arg removal, etc */
    G_cg->post_call_cleanup(named_args);

    /* if we're not discarding the result, push it from R0 */
    if (!discard)
    {
        G_cg->write_op(OPC_GETR0);
        G_cg->note_push();
    }
}